

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

bool peparse::parse_resource_table
               (bounded_buffer *sectionData,uint32_t o,uint32_t virtaddr,uint32_t depth,
               resource_dir_entry *dirent,
               vector<peparse::resource,_std::allocator<peparse::resource>_> *rsrcs)

{
  bool bVar1;
  resource_dir_entry *this;
  ulong uVar2;
  string *result;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  _func_ios_base_ptr_ios_base_ptr *f_01;
  _func_ios_base_ptr_ios_base_ptr *f_02;
  _func_ios_base_ptr_ios_base_ptr *f_03;
  _func_ios_base_ptr_ios_base_ptr *f_04;
  _func_ios_base_ptr_ios_base_ptr *f_05;
  _func_ios_base_ptr_ios_base_ptr *f_06;
  _func_ios_base_ptr_ios_base_ptr *f_07;
  _func_ios_base_ptr_ios_base_ptr *f_08;
  _func_ios_base_ptr_ios_base_ptr *f_09;
  _func_ios_base_ptr_ios_base_ptr *f_10;
  _func_ios_base_ptr_ios_base_ptr *f_11;
  uint32_t uVar3;
  ulong uVar4;
  long lVar5;
  uint32_t offset;
  uint32_t *out;
  string local_118;
  uint local_f4;
  resource_dir_table rdt;
  undefined1 local_e0 [32];
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  bounded_buffer *pbStack_68;
  uint32_t local_5c;
  resource_dat_entry rdat;
  
  if (sectionData != (bounded_buffer *)0x0) {
    bVar1 = readDword(sectionData,o,&rdt.Characteristics);
    if (bVar1) {
      bVar1 = readDword(sectionData,o + 4,&rdt.TimeDateStamp);
      if (bVar1) {
        bVar1 = readWord(sectionData,o + 8,&rdt.MajorVersion);
        if (bVar1) {
          bVar1 = readWord(sectionData,o + 10,&rdt.MinorVersion);
          if (bVar1) {
            bVar1 = readWord(sectionData,o + 0xc,&rdt.NameEntries);
            if (bVar1) {
              bVar1 = readWord(sectionData,o + 0xe,&rdt.IDEntries);
              if (bVar1) {
                if (rdt.NameEntries == 0 && rdt.IDEntries == 0) {
                  return true;
                }
                offset = o + 0x10;
                local_5c = depth + 1;
                uVar2 = (ulong)(depth != 1) * 0x20;
                lVar5 = 0x18;
                if (depth != 0) {
                  lVar5 = uVar2 + 0x38;
                }
                uVar4 = 0x20;
                if (depth != 0) {
                  uVar4 = uVar2 | 0x40;
                }
                local_f4 = 0;
                do {
                  if ((uint)rdt.IDEntries + (uint)rdt.NameEntries <= local_f4) {
                    return true;
                  }
                  this = dirent;
                  if (dirent == (resource_dir_entry *)0x0) {
                    this = (resource_dir_entry *)operator_new(0x78);
                    resource_dir_entry::resource_dir_entry(this);
                  }
                  bVar1 = readDword(sectionData,offset,&this->ID);
                  if (!bVar1) {
                    err = 6;
                    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                    to_string<unsigned_int>(&local_118,0x2ab,f_05);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_e0,":",&local_118);
                    std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
LAB_001116c0:
                    std::__cxx11::string::~string((string *)local_e0);
                    std::__cxx11::string::~string((string *)&local_118);
joined_r0x00111702:
                    if (dirent != (resource_dir_entry *)0x0) {
                      return false;
                    }
                    resource_dir_entry::~resource_dir_entry(this);
                    operator_delete(this,0x78);
                    return false;
                  }
                  out = &this->RVA;
                  bVar1 = readDword(sectionData,offset + 4,out);
                  if (!bVar1) {
                    err = 6;
                    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                    to_string<unsigned_int>(&local_118,0x2b4,f_06);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_e0,":",&local_118);
                    std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
                    goto LAB_001116c0;
                  }
                  if (depth == 0) {
                    this->type = this->ID;
                    if (local_f4 < rdt.NameEntries) {
                      uVar3 = this->ID & 0xfffffff;
                      result = &this->type_str;
LAB_00111024:
                      bVar1 = parse_resource_id(sectionData,uVar3,result);
                      if (!bVar1) goto joined_r0x00111702;
                    }
                  }
                  else if (depth == 2) {
                    this->lang = this->ID;
                    if (local_f4 < rdt.NameEntries) {
                      uVar3 = this->ID & 0xfffffff;
                      result = &this->lang_str;
                      goto LAB_00111024;
                    }
                  }
                  else {
                    if (depth != 1) {
                      err = 4;
                      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                      to_string<unsigned_int>(&local_118,0x2e5,f_11);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_e0,":",&local_118);
                      std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
                      goto LAB_00111476;
                    }
                    this->name = this->ID;
                    if (local_f4 < rdt.NameEntries) {
                      uVar3 = this->ID & 0xfffffff;
                      result = &this->name_str;
                      goto LAB_00111024;
                    }
                  }
                  uVar3 = *out;
                  if (-1 < (int)uVar3) {
                    bVar1 = readDword(sectionData,uVar3,&rdat.RVA);
                    if (bVar1) {
                      bVar1 = readDword(sectionData,*out + 4,&rdat.size);
                      if (bVar1) {
                        bVar1 = readDword(sectionData,*out + 8,&rdat.codepage);
                        if (bVar1) {
                          bVar1 = readDword(sectionData,*out + 0xc,&rdat.reserved);
                          if (bVar1) {
                            local_e0._0_8_ = local_e0 + 0x10;
                            local_e0._8_8_ = 0;
                            local_e0[0x10] = '\0';
                            local_c0._M_p = (pointer)&local_b0;
                            local_b8 = 0;
                            local_b0._M_local_buf[0] = '\0';
                            local_a0._M_p = (pointer)&local_90;
                            local_98 = 0;
                            local_90._M_local_buf[0] = '\0';
                            local_70._0_4_ = 0;
                            local_70._4_4_ = 0;
                            pbStack_68 = (bounded_buffer *)0x0;
                            local_80._0_4_ = 0;
                            local_80._4_4_ = 0;
                            uStack_78._0_4_ = 0;
                            uStack_78._4_4_ = 0;
                            std::__cxx11::string::_M_assign((string *)local_e0);
                            std::__cxx11::string::_M_assign((string *)&local_c0);
                            std::__cxx11::string::_M_assign((string *)&local_a0);
                            local_80._0_4_ = this->type;
                            local_80._4_4_ = this->name;
                            uStack_78._4_4_ = rdat.codepage;
                            uStack_78._0_4_ = this->lang;
                            if (((rdat.RVA < virtaddr) ||
                                (pbStack_68 = splitBuffer(sectionData,rdat.RVA - virtaddr,
                                                          rdat.size + (rdat.RVA - virtaddr)),
                                pbStack_68 == (bounded_buffer *)0x0)) &&
                               (pbStack_68 = splitBuffer(sectionData,0,0),
                               pbStack_68 == (bounded_buffer *)0x0)) {
                              if (dirent == (resource_dir_entry *)0x0) {
                                resource_dir_entry::~resource_dir_entry(this);
                                operator_delete(this,0x78);
                              }
                              resource::~resource((resource *)local_e0);
                              return false;
                            }
                            std::vector<peparse::resource,_std::allocator<peparse::resource>_>::
                            push_back(rsrcs,(value_type *)local_e0);
                            resource::~resource((resource *)local_e0);
                            goto LAB_00111206;
                          }
                          err = 6;
                          std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                          to_string<unsigned_int>(&local_118,0x324,f_10);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_e0,":",&local_118);
                          std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
                        }
                        else {
                          err = 6;
                          std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                          to_string<unsigned_int>(&local_118,0x31a,f_09);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_e0,":",&local_118);
                          std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
                        }
                      }
                      else {
                        err = 6;
                        std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                        to_string<unsigned_int>(&local_118,0x310,f_08);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_e0,":",&local_118);
                        std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
                      }
                    }
                    else {
                      err = 6;
                      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                      to_string<unsigned_int>(&local_118,0x306,f_07);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_e0,":",&local_118);
                      std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
                    }
                    goto LAB_001116c0;
                  }
                  bVar1 = parse_resource_table
                                    (sectionData,uVar3 & 0xfffffff,virtaddr,local_5c,this,rsrcs);
                  if (!bVar1) goto joined_r0x00111702;
LAB_00111206:
                  *(undefined8 *)((long)&this->ID + uVar4) = 0;
                  **(undefined1 **)((long)&this->ID + lVar5) = 0;
                  if (dirent == (resource_dir_entry *)0x0) {
                    resource_dir_entry::~resource_dir_entry(this);
                    operator_delete(this,0x78);
                  }
                  local_f4 = local_f4 + 1;
                  offset = offset + 8;
                } while( true );
              }
              err = 6;
              std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
              to_string<unsigned_int>(&local_118,0x29a,f_04);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e0,":",&local_118);
              std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
            }
            else {
              err = 6;
              std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
              to_string<unsigned_int>(&local_118,0x299,f_03);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e0,":",&local_118);
              std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
            }
          }
          else {
            err = 6;
            std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
            to_string<unsigned_int>(&local_118,0x298,f_02);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,":",&local_118);
            std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
          }
        }
        else {
          err = 6;
          std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
          to_string<unsigned_int>(&local_118,0x297,f_01);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0,":",&local_118);
          std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
        }
      }
      else {
        err = 6;
        std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
        to_string<unsigned_int>(&local_118,0x296,f_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,":",&local_118);
        std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
      }
    }
    else {
      err = 6;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>(&local_118,0x295,f);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     ":",&local_118);
      std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
    }
LAB_00111476:
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)&local_118);
  }
  return false;
}

Assistant:

bool parse_resource_table(bounded_buffer *sectionData,
                          std::uint32_t o,
                          std::uint32_t virtaddr,
                          std::uint32_t depth,
                          resource_dir_entry *dirent,
                          std::vector<resource> &rsrcs) {
  resource_dir_table rdt;

  if (sectionData == nullptr) {
    return false;
  }

  READ_DWORD(sectionData, o, rdt, Characteristics);
  READ_DWORD(sectionData, o, rdt, TimeDateStamp);
  READ_WORD(sectionData, o, rdt, MajorVersion);
  READ_WORD(sectionData, o, rdt, MinorVersion);
  READ_WORD(sectionData, o, rdt, NameEntries);
  READ_WORD(sectionData, o, rdt, IDEntries);

  o += sizeof(resource_dir_table);

  if (rdt.NameEntries == 0u && rdt.IDEntries == 0u) {
    return true; // This is not a hard error. It does happen.
  }

  for (std::uint32_t i = 0;
       i < static_cast<std::uint32_t>(rdt.NameEntries + rdt.IDEntries);
       i++) {
    resource_dir_entry *rde = dirent;
    if (dirent == nullptr) {
      rde = new resource_dir_entry;
    }

    if (!readDword(sectionData, o + offsetof(__typeof__(*rde), ID), rde->ID)) {
      PE_ERR(PEERR_READ);
      if (dirent == nullptr) {
        delete rde;
      }
      return false;
    }

    if (!readDword(
            sectionData, o + offsetof(__typeof__(*rde), RVA), rde->RVA)) {
      PE_ERR(PEERR_READ);
      if (dirent == nullptr) {
        delete rde;
      }
      return false;
    }

    o += sizeof(resource_dir_entry_sz);

    if (depth == 0) {
      rde->type = rde->ID;
      if (i < rdt.NameEntries) {
        if (!parse_resource_id(
                sectionData, rde->ID & 0x0FFFFFFF, rde->type_str)) {
          if (dirent == nullptr) {
            delete rde;
          }
          return false;
        }
      }
    } else if (depth == 1) {
      rde->name = rde->ID;
      if (i < rdt.NameEntries) {
        if (!parse_resource_id(
                sectionData, rde->ID & 0x0FFFFFFF, rde->name_str)) {
          if (dirent == nullptr) {
            delete rde;
          }
          return false;
        }
      }
    } else if (depth == 2) {
      rde->lang = rde->ID;
      if (i < rdt.NameEntries) {
        if (!parse_resource_id(
                sectionData, rde->ID & 0x0FFFFFFF, rde->lang_str)) {
          if (dirent == nullptr) {
            delete rde;
          }
          return false;
        }
      }
    } else {
      /* .rsrc can accommodate up to 2**31 levels, but Windows only uses 3 by
       * convention. As such, any depth above 3 indicates potentially unchecked
       * recursion. See:
       * https://docs.microsoft.com/en-us/windows/desktop/debug/pe-format#the-rsrc-section
       */

      PE_ERR(PEERR_RESC);
      return false;
    }

    // High bit 0 = RVA to RDT.
    // High bit 1 = RVA to RDE.
    if (rde->RVA & 0x80000000) {
      if (!parse_resource_table(sectionData,
                                rde->RVA & 0x0FFFFFFF,
                                virtaddr,
                                depth + 1,
                                rde,
                                rsrcs)) {
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }
    } else {
      resource_dat_entry rdat;

      /*
       * This one is using rde->RVA as an offset.
       *
       * This is because we don't want to set o because we have to keep the
       * original value when we are done parsing this resource data entry.
       * We could store the original o value and reset it when we are done,
       * but meh.
       */

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), RVA),
                     rdat.RVA)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), size),
                     rdat.size)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), codepage),
                     rdat.codepage)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), reserved),
                     rdat.reserved)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      resource rsrc;
      rsrc.type_str = rde->type_str;
      rsrc.name_str = rde->name_str;
      rsrc.lang_str = rde->lang_str;
      rsrc.type = rde->type;
      rsrc.name = rde->name;
      rsrc.lang = rde->lang;
      rsrc.codepage = rdat.codepage;
      rsrc.RVA = rdat.RVA;
      rsrc.size = rdat.size;

      // The start address is (RVA - section virtual address).
      uint32_t start = rdat.RVA - virtaddr;
      /*
       * Some binaries (particularly packed) will have invalid addresses here.
       * If those happen, return a zero length buffer.
       * If the start is valid, try to get the data and if that fails return
       * a zero length buffer.
       */
      if (start > rdat.RVA) {
        rsrc.buf = splitBuffer(sectionData, 0, 0);
      } else {
        rsrc.buf = splitBuffer(sectionData, start, start + rdat.size);
        if (rsrc.buf == nullptr) {
          rsrc.buf = splitBuffer(sectionData, 0, 0);
        }
      }

      /* If we can't get even a zero length buffer, something is very wrong. */
      if (rsrc.buf == nullptr) {
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      rsrcs.push_back(rsrc);
    }

    if (depth == 0) {
      rde->type_str.clear();
    } else if (depth == 1) {
      rde->name_str.clear();
    } else if (depth == 2) {
      rde->lang_str.clear();
    }

    if (dirent == nullptr) {
      delete rde;
    }
  }

  return true;
}